

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_telnet.c
# Opt level: O0

oonf_telnet_result oonf_telnet_execute(char *cmd,char *para,autobuf *out,netaddr *remote)

{
  list_entity *plVar1;
  list_entity *plVar2;
  oonf_telnet_result local_3bc;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  undefined1 local_370 [4];
  oonf_telnet_result result;
  oonf_telnet_session session;
  oonf_telnet_cleanup *it;
  oonf_telnet_cleanup *handler;
  netaddr *remote_local;
  autobuf *out_local;
  char *para_local;
  char *cmd_local;
  
  memset(local_370,0,0x300);
  session.data.stop_timer._clock = (uint64_t)&session.data.stop_timer._clock;
  session.session._568_8_ = remote;
  session.data.remote = (netaddr *)out;
  session.data.out = (autobuf *)cmd;
  session.data.command = para;
  session.data.cleanup_list.next = (list_entity *)session.data.stop_timer._clock;
  local_3bc = _telnet_handle_command((oonf_telnet_data *)&session.session.send_first);
  _call_stop_handler((oonf_telnet_data *)&session.session.send_first);
  it = (oonf_telnet_cleanup *)(session.data.stop_timer._clock - 0x18);
  plVar1 = *(list_entity **)session.data.stop_timer._clock;
  while (session.data.cleanup_list.prev = (list_entity *)&plVar1[-2].prev,
        (it->node).prev != session.data.cleanup_list.next) {
    plVar1 = (it->node).prev;
    plVar2 = (it->node).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (it->node).prev = (list_entity *)0x0;
    (it->node).next = (list_entity *)0x0;
    (*it->cleanup_handler)(it);
    it = (oonf_telnet_cleanup *)session.data.cleanup_list.prev;
    plVar1 = session.data.cleanup_list.prev[1].prev;
  }
  if ((session.data.remote[1]._addr[6] & 1) != 0) {
    local_3bc = TELNET_RESULT_INTERNAL_ERROR;
  }
  return local_3bc;
}

Assistant:

enum oonf_telnet_result
oonf_telnet_execute(const char *cmd, const char *para, struct autobuf *out, struct netaddr *remote)
{
  struct oonf_telnet_cleanup *handler, *it;
  struct oonf_telnet_session session;
  enum oonf_telnet_result result;

  memset(&session, 0, sizeof(session));
  session.data.command = cmd;
  session.data.parameter = para;
  session.data.out = out;
  session.data.remote = remote;

  list_init_head(&session.data.cleanup_list);

  result = _telnet_handle_command(&session.data);
  _call_stop_handler(&session.data);

  /* call all cleanup handlers */
  list_for_each_element_safe(&session.data.cleanup_list, handler, node, it) {
    /* remove from list first */
    oonf_telnet_remove_cleanup(handler);

    /* after this command the handler pointer might not be valid anymore */
    handler->cleanup_handler(handler);
  }

  return abuf_has_failed(session.data.out) ? TELNET_RESULT_INTERNAL_ERROR : result;
}